

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O3

void __thiscall VmaJsonWriter::WriteIndent(VmaJsonWriter *this,bool oneLess)

{
  size_t sVar1;
  VmaVector<char,_VmaStlAllocator<char>_> *this_00;
  ulong uVar2;
  ulong uVar3;
  
  sVar1 = (this->m_Stack).m_Count;
  if ((sVar1 != 0) && ((this->m_Stack).m_pArray[sVar1 - 1].singleLineMode == false)) {
    this_00 = &this->m_SB->m_Data;
    sVar1 = this_00->m_Count;
    VmaVector<char,_VmaStlAllocator<char>_>::resize(this_00,sVar1 + 1);
    this_00->m_pArray[sVar1] = '\n';
    uVar2 = (this->m_Stack).m_Count;
    if (uVar2 != oneLess && uVar2 != 0) {
      uVar3 = 0;
      do {
        VmaStringBuilder::Add(this->m_SB,"  ");
        uVar3 = uVar3 + 1;
      } while (uVar3 < uVar2 - oneLess);
    }
  }
  return;
}

Assistant:

size_t size() const { return m_Count; }